

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

void __thiscall FatSystem::~FatSystem(FatSystem *this)

{
  FatSystem *this_local;
  
  close(this->fd);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            (&this->cache);
  std::__cxx11::string::~string((string *)&this->fsType);
  std::__cxx11::string::~string((string *)&this->oemName);
  std::__cxx11::string::~string((string *)&this->diskLabel);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FatSystem::~FatSystem()
{
    close(fd);
}